

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SenderFlow.cpp
# Opt level: O2

void __thiscall SenderFlow::~SenderFlow(SenderFlow *this)

{
  end_transmission(this);
  zmq_close(this->m_stream_socket);
  zmq_close(this->m_notif_socket);
  zmq_ctx_term(this->m_context);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

SenderFlow::~SenderFlow()
{
    // Send graceful end of transmission notification
    end_transmission();
    // safely close all ZMQ entities.
    zmq_close(m_stream_socket);
    zmq_close(m_notif_socket);
    zmq_ctx_term(m_context);
}